

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O0

int Cec_ManSimCompareConst(uint *p,int nWords)

{
  int local_20;
  int w;
  int nWords_local;
  uint *p_local;
  
  if ((*p & 1) == 0) {
    for (local_20 = 0; local_20 < nWords; local_20 = local_20 + 1) {
      if (p[local_20] != 0) {
        return 0;
      }
    }
  }
  else {
    for (local_20 = 0; local_20 < nWords; local_20 = local_20 + 1) {
      if (p[local_20] != 0xffffffff) {
        return 0;
      }
    }
  }
  return 1;
}

Assistant:

int Cec_ManSimCompareConst( unsigned * p, int nWords )
{
    int w;
    if ( p[0] & 1 )
    {
        for ( w = 0; w < nWords; w++ )
            if ( p[w] != ~0 )
                return 0;
        return 1;
    }
    else
    {
        for ( w = 0; w < nWords; w++ )
            if ( p[w] != 0 )
                return 0;
        return 1;
    }
}